

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

QString * QUtf32::convertToUnicode
                    (QString *__return_storage_ptr__,QByteArrayView in,State *state,
                    DataEndianness endian)

{
  QUtf32 *this;
  QChar *pQVar1;
  char16_t *pcVar2;
  DataEndianness in_R9D;
  QByteArrayView in_00;
  __off_t __length;
  
  in_00.m_size = in.m_data;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  QString::resize(__return_storage_ptr__,(long)((long)&((QChar *)in.m_size)[3].ucs + 1) >> 1);
  this = (QUtf32 *)QString::data(__return_storage_ptr__);
  in_00.m_data = (storage_type *)state;
  pQVar1 = convertToUnicode(this,(QChar *)in.m_size,in_00,(State *)(ulong)endian,in_R9D);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  if (pcVar2 == (char16_t *)0x0) {
    pcVar2 = L"";
  }
  QString::truncate(__return_storage_ptr__,(char *)((long)pQVar1 - (long)pcVar2 >> 1),__length);
  return __return_storage_ptr__;
}

Assistant:

QString QUtf32::convertToUnicode(QByteArrayView in, QStringConverter::State *state, DataEndianness endian)
{
    QString result;
    result.resize((in.size() + 7) >> 1); // worst case
    QChar *end = convertToUnicode(result.data(), in, state, endian);
    result.truncate(end - result.constData());
    return result;
}